

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O0

void __thiscall
BackwardPass::
ForEachAddPropertyCacheBucket<BackwardPass::InsertTypeTransitionsAtPotentialKills()::__0>
          (BackwardPass *this,anon_class_16_2_f7f4a3d9 fn)

{
  BasicBlock *pBVar1;
  code *pcVar2;
  Bucket<AddPropertyCacheBucket> *this_00;
  bool bVar3;
  undefined4 *puVar4;
  Type_conflict node;
  bool local_99;
  JITTypeHolder JStack_80;
  bool done;
  JITTypeHolderBase<void> local_78;
  nullptr_t local_70;
  JITTypeHolderBase<void> local_68;
  Type *local_60;
  AddPropertyCacheBucket *data;
  Bucket<AddPropertyCacheBucket> *bucket;
  Iterator __iter;
  uint _iterHash;
  BasicBlock *block;
  BackwardPass *this_local;
  anon_class_16_2_f7f4a3d9 fn_local;
  
  fn_local.this = (BackwardPass *)fn.instr;
  this_local = fn.this;
  pBVar1 = this->currentBlock;
  if (pBVar1->stackSymToFinalType !=
      (HashTable<AddPropertyCacheBucket,_Memory::ArenaAllocator> *)0x0) {
    for (__iter.current._4_4_ = 0; __iter.current._4_4_ < pBVar1->stackSymToFinalType->tableSize;
        __iter.current._4_4_ = __iter.current._4_4_ + 1) {
      _bucket = SListBase<Bucket<AddPropertyCacheBucket>,_Memory::ArenaAllocator,_RealCount>::
                GetIterator(pBVar1->stackSymToFinalType->table + __iter.current._4_4_);
      do {
        fn_local.instr = (Instr **)&bucket;
        if (__iter.list ==
            (SListBase<Bucket<AddPropertyCacheBucket>,_Memory::ArenaAllocator,_RealCount> *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                             ,0x76,"(current != nullptr)","current != nullptr");
          if (!bVar3) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 0;
        }
        this_00 = bucket;
        node = SListNodeBase<Memory::ArenaAllocator>::Next
                         (&(__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>);
        bVar3 = SListBase<Bucket<AddPropertyCacheBucket>,_Memory::ArenaAllocator,_RealCount>::IsHead
                          ((SListBase<Bucket<AddPropertyCacheBucket>,_Memory::ArenaAllocator,_RealCount>
                            *)this_00,node);
        if (bVar3) break;
        SListNodeBase<Memory::ArenaAllocator>::Next
                  (&(__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>);
        local_60 = SListBase<Bucket<AddPropertyCacheBucket>,_Memory::ArenaAllocator,_RealCount>::
                   Iterator::Data((Iterator *)&bucket);
        data = &local_60->element;
        local_68.t = (Type)AddPropertyCacheBucket::GetInitialType(&local_60->element);
        local_70 = (nullptr_t)0x0;
        bVar3 = JITTypeHolderBase<void>::operator!=(&local_68,&local_70);
        local_99 = false;
        if (bVar3) {
          local_78.t = (Type)AddPropertyCacheBucket::GetInitialType(&local_60->element);
          JStack_80 = AddPropertyCacheBucket::GetFinalType(&local_60->element);
          local_99 = JITTypeHolderBase<void>::operator!=(&local_78,&stack0xffffffffffffff80);
        }
      } while ((local_99 == false) ||
              (bVar3 = InsertTypeTransitionsAtPotentialKills::anon_class_16_2_f7f4a3d9::operator()
                                 ((anon_class_16_2_f7f4a3d9 *)&this_local,
                                  *(int *)&data[1].initialType.t,&local_60->element), !bVar3));
    }
  }
  return;
}

Assistant:

void
BackwardPass::ForEachAddPropertyCacheBucket(Fn fn)
{
    BasicBlock *block = this->currentBlock;
    if (block->stackSymToFinalType == nullptr)
    {
        return;
    }

    FOREACH_HASHTABLE_ENTRY(AddPropertyCacheBucket, bucket, block->stackSymToFinalType)
    {
        AddPropertyCacheBucket *data = &bucket.element;
        if (data->GetInitialType() != nullptr &&
            data->GetInitialType() != data->GetFinalType())
        {
            bool done = fn(bucket.value, data);
            if (done)
            {
                break;
            }
        }
    }
    NEXT_HASHTABLE_ENTRY;
}